

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O3

string * __thiscall
libtorrent::read_piece_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,read_piece_alert *this)

{
  uint uVar1;
  error_category *peVar2;
  _Alloc_hider _Var3;
  size_t sVar4;
  char msg [200];
  string local_128;
  long *local_108 [2];
  long local_f8 [2];
  char local_e8 [200];
  
  if ((this->error).failed_ == true) {
    torrent_alert::message_abi_cxx11_(&local_128,&this->super_torrent_alert);
    _Var3._M_p = local_128._M_dataplus._M_p;
    uVar1 = (this->piece).m_val;
    peVar2 = (this->error).cat_;
    (*peVar2->_vptr_error_category[4])(local_108,peVar2,(ulong)(uint)(this->error).val_);
    snprintf(local_e8,200,"%s: read_piece %d failed: %s",_Var3._M_p,(ulong)uVar1,local_108[0]);
    if (local_108[0] != local_f8) {
      operator_delete(local_108[0],local_f8[0] + 1);
    }
  }
  else {
    torrent_alert::message_abi_cxx11_(&local_128,&this->super_torrent_alert);
    snprintf(local_e8,200,"%s: read_piece %d successful",local_128._M_dataplus._M_p,
             (ulong)(uint)(this->piece).m_val);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar4 = strlen(local_e8);
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_e8,local_e8 + sVar4);
  return __return_storage_ptr__;
}

Assistant:

std::string read_piece_alert::message() const
	{
#ifdef TORRENT_DISABLE_ALERT_MSG
		return {};
#else
		char msg[200];
		if (error)
		{
			std::snprintf(msg, sizeof(msg), "%s: read_piece %d failed: %s"
				, torrent_alert::message().c_str() , static_cast<int>(piece)
				, error.message().c_str());
		}
		else
		{
			std::snprintf(msg, sizeof(msg), "%s: read_piece %d successful"
				, torrent_alert::message().c_str() , static_cast<int>(piece));
		}
		return msg;
#endif
	}